

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

int QUtil::call_main_from_wmain(int argc,wchar_t **argv,function<int_(int,_char_**)> *realmain)

{
  int iVar1;
  function<int_(int,_char_**)> local_40;
  function<int_(int,_char_**)> *local_20;
  function<int_(int,_char_**)> *realmain_local;
  wchar_t **argv_local;
  int argc_local;
  
  local_20 = realmain;
  realmain_local = (function<int_(int,_char_**)> *)argv;
  argv_local._4_4_ = argc;
  std::function<int_(int,_char_**)>::function(&local_40,realmain);
  iVar1 = ::call_main_from_wmain(true,argc,argv,&local_40);
  std::function<int_(int,_char_**)>::~function(&local_40);
  return iVar1;
}

Assistant:

int
QUtil::call_main_from_wmain(int argc, wchar_t* argv[], std::function<int(int, char*[])> realmain)
{
    return ::call_main_from_wmain(true, argc, argv, realmain);
}